

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_optimize_for.pb.cc
# Opt level: O3

void proto2_unittest::TestOptimizedForSize::SharedDtor(MessageLite *self)

{
  int iVar1;
  ForeignMessage *this;
  ulong uVar2;
  
  uVar2 = (self->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
    uVar2 = (self->_internal_metadata_).ptr_;
  }
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 == 0) {
    this = (ForeignMessage *)self[3]._vptr_MessageLite;
    if (this != (ForeignMessage *)0x0) {
      ForeignMessage::~ForeignMessage(this);
    }
    operator_delete(this,0x20);
    iVar1 = (int)self[4]._internal_metadata_.ptr_;
    if (iVar1 != 0) {
      if (iVar1 == 3) {
        google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 4));
      }
      *(undefined4 *)&self[4]._internal_metadata_.ptr_ = 0;
    }
    google::protobuf::internal::ExtensionSet::~ExtensionSet((ExtensionSet *)(self + 1));
    return;
  }
  SharedDtor((TestOptimizedForSize *)&stack0xffffffffffffffe0);
}

Assistant:

inline void TestOptimizedForSize::SharedDtor(MessageLite& self) {
  TestOptimizedForSize& this_ = static_cast<TestOptimizedForSize&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.msg_;
  if (this_.has_foo()) {
    this_.clear_foo();
  }
  this_._impl_.~Impl_();
}